

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O1

FunctionCodeGenJitTimeData * __thiscall
Js::FunctionCodeGenJitTimeData::AddInlinee
          (FunctionCodeGenJitTimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          FunctionInfo *inlinee,bool isInlined)

{
  Type *addr;
  Type *pTVar1;
  ushort uVar2;
  long lVar3;
  FunctionCodeGenJitTimeData *pFVar4;
  code *pcVar5;
  bool bVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  FunctionBody *pFVar9;
  Recycler *this_00;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *pWVar10;
  FunctionCodeGenJitTimeData *pFVar11;
  char *addr_00;
  size_t size;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x81,"(recycler)","recycler");
    if (!bVar6) goto LAB_0043a538;
    *puVar8 = 0;
  }
  pFVar9 = GetFunctionBody(this);
  if (pFVar9 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x83,"(functionBody)","functionBody");
    if (!bVar6) goto LAB_0043a538;
    *puVar8 = 0;
  }
  if (pFVar9->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x84,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar6) goto LAB_0043a538;
    *puVar8 = 0;
  }
  if (inlinee == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x85,"(inlinee)","inlinee");
    if (!bVar6) goto LAB_0043a538;
    *puVar8 = 0;
  }
  addr = &this->inlinees;
  data._32_8_ = inlinee;
  if ((this->inlinees).ptr == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    data.plusSize = (size_t)pFVar9->profiledCallSiteCount;
    local_78 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_d5dfd3;
    data.filename._0_4_ = 0x89;
    this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_78);
    uVar2 = pFVar9->profiledCallSiteCount;
    if (uVar2 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      pWVar10 = (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)&DAT_00000008;
    }
    else {
      BVar7 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar6) goto LAB_0043a538;
        *puVar8 = 0;
      }
      size = (ulong)uVar2 << 3;
      pWVar10 = (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)
                Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                          (this_00,size);
      if (pWVar10 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar6) {
LAB_0043a538:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar8 = 0;
      }
      memset(pWVar10,0,size);
    }
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pWVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  lVar3 = *(long *)((long)&addr->ptr->ptr + (ulong)((uint)profiledCallSiteId * 8));
  pFVar11 = New(recycler,(FunctionInfo *)data._32_8_,(EntryPointInfo *)0x0,isInlined);
  addr_00 = (char *)((long)&addr->ptr->ptr + (ulong)((uint)profiledCallSiteId * 8));
  if (lVar3 == 0) {
    Memory::Recycler::WBSetBit(addr_00);
    *(FunctionCodeGenJitTimeData **)addr_00 = pFVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
    pTVar1 = &this->inlineeCount;
    *pTVar1 = *pTVar1 + 1;
    if (*pTVar1 == 0) {
      Throw::OutOfMemory();
    }
  }
  else {
    pFVar4 = *(FunctionCodeGenJitTimeData **)addr_00;
    Memory::Recycler::WBSetBit((char *)&pFVar11->next);
    (pFVar11->next).ptr = pFVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pFVar11->next);
    pWVar10 = addr->ptr + profiledCallSiteId;
    Memory::Recycler::WBSetBit((char *)pWVar10);
    pWVar10->ptr = pFVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar10);
  }
  return pFVar11;
}

Assistant:

FunctionCodeGenJitTimeData *FunctionCodeGenJitTimeData::AddInlinee(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        FunctionInfo *const inlinee,
        bool isInlined)
    {
        Assert(recycler);
        const auto functionBody = GetFunctionBody();
        Assert(functionBody);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(inlinee);

        if (!inlinees)
        {
            inlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenJitTimeData *), functionBody->GetProfiledCallSiteCount());
        }

        FunctionCodeGenJitTimeData *inlineeData = nullptr;
        if (!inlinees[profiledCallSiteId])
        {
            inlineeData = FunctionCodeGenJitTimeData::New(recycler, inlinee, nullptr /* entryPoint */, isInlined);
            inlinees[profiledCallSiteId] = inlineeData;
            if (++inlineeCount == 0)
            {
                Js::Throw::OutOfMemory();
            }
        }
        else
        {
            inlineeData = FunctionCodeGenJitTimeData::New(recycler, inlinee, nullptr /* entryPoint */, isInlined);
            // This is polymorphic, chain the data.
            inlineeData->next = inlinees[profiledCallSiteId];
            inlinees[profiledCallSiteId] = inlineeData;
        }
        return inlineeData;
    }